

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.h
# Opt level: O2

bool ispring::File::DirectoryCopy(string *src,string *dst)

{
  int iVar1;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"cp -r ",src);
  std::operator+(&local_70,&local_30," ");
  std::operator+(&local_50,&local_70,dst);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  iVar1 = system(local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  return iVar1 == 0;
}

Assistant:

inline bool DirectoryCopy(std::string src, std::string dst) {
			std::string cmd="cp -r " + src + " " + dst;
			return system(cmd.c_str())==0;
		}